

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O2

bool google::protobuf::compiler::csharp::IsWrapperType(FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  
  TVar2 = FieldDescriptor::type(descriptor);
  if (TVar2 == TYPE_MESSAGE) {
    pDVar3 = FieldDescriptor::message_type(descriptor);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            **(undefined8 **)(pDVar3 + 0x10),"google/protobuf/wrappers.proto");
    return bVar1;
  }
  return false;
}

Assistant:

inline bool IsWrapperType(const FieldDescriptor* descriptor) {
  return descriptor->type() == FieldDescriptor::TYPE_MESSAGE &&
      descriptor->message_type()->file()->name() == "google/protobuf/wrappers.proto";
}